

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_filter.cpp
# Opt level: O0

bool __thiscall BamTools::FilterTool::FilterToolPrivate::Run(FilterToolPrivate *this)

{
  byte bVar1;
  bool bVar2;
  undefined1 uVar3;
  char *pcVar4;
  ostream *poVar5;
  istream *piVar6;
  vector<BamTools::RefData,_std::allocator<BamTools::RefData>_> *in_RDI;
  BamRegion region;
  BamAlignment al;
  BamWriter writer;
  CompressionMode compressionMode;
  bool writeUncompressed;
  string headerText;
  BamMultiReader reader;
  string line;
  ifstream filelist;
  BamAlignment *in_stack_fffffffffffffb38;
  BamAlignment *in_stack_fffffffffffffb40;
  value_type *in_stack_fffffffffffffb48;
  vector<BamTools::RefData,_std::allocator<BamTools::RefData>_> *in_stack_fffffffffffffb50;
  undefined4 in_stack_fffffffffffffb58;
  undefined1 in_stack_fffffffffffffb5c;
  undefined1 in_stack_fffffffffffffb5d;
  undefined1 in_stack_fffffffffffffb5e;
  undefined1 in_stack_fffffffffffffb5f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb60;
  undefined4 in_stack_fffffffffffffb68;
  undefined1 in_stack_fffffffffffffb6e;
  undefined1 in_stack_fffffffffffffb6f;
  BamMultiReader *in_stack_fffffffffffffb70;
  BamAlignment *in_stack_fffffffffffffb80;
  size_type *in_stack_fffffffffffffbd8;
  int local_410 [4];
  BamRegion local_400 [3];
  int local_3d0;
  int local_348;
  int local_344;
  BamRegion *in_stack_fffffffffffffcc8;
  BamMultiReader *in_stack_fffffffffffffcd0;
  string *in_stack_fffffffffffffcd8;
  string local_270 [40];
  string local_248 [32];
  int local_228;
  istream local_218 [535];
  byte local_1;
  
  if ((((byte)((in_RDI[1].super__Vector_base<BamTools::RefData,_std::allocator<BamTools::RefData>_>.
                _M_impl.super__Vector_impl_data._M_start)->RefName)._M_dataplus & 1) == 0) &&
     ((((in_RDI[1].super__Vector_base<BamTools::RefData,_std::allocator<BamTools::RefData>_>._M_impl
         .super__Vector_impl_data._M_start)->RefName).field_0x1 & 1) == 0)) {
    in_stack_fffffffffffffbd8 =
         &((in_RDI[1].super__Vector_base<BamTools::RefData,_std::allocator<BamTools::RefData>_>.
            _M_impl.super__Vector_impl_data._M_start)->RefName)._M_string_length;
    Options::StandardIn_abi_cxx11_();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
  }
  if ((((in_RDI[1].super__Vector_base<BamTools::RefData,_std::allocator<BamTools::RefData>_>._M_impl
         .super__Vector_impl_data._M_start)->RefName).field_0x1 & 1) != 0) {
    pcVar4 = (char *)std::__cxx11::string::c_str();
    std::ifstream::ifstream(local_218,pcVar4,_S_in);
    bVar1 = std::ifstream::is_open();
    if ((bVar1 & 1) == 0) {
      poVar5 = std::operator<<((ostream *)&std::cerr,
                               "bamtools filter ERROR: could not open input BAM file list... Aborting."
                              );
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      local_1 = 0;
      local_228 = 1;
    }
    else {
      std::__cxx11::string::string(local_248);
      while( true ) {
        piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_218,local_248)
        ;
        bVar2 = std::ios::operator_cast_to_bool
                          ((ios *)(piVar6 + *(long *)(*(long *)piVar6 + -0x18)));
        if (!bVar2) break;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
      }
      std::__cxx11::string::~string(local_248);
      local_228 = 0;
    }
    std::ifstream::~ifstream(local_218);
    if (local_228 != 0) goto LAB_00201ecd;
  }
  bVar2 = SetupFilters((FilterToolPrivate *)in_stack_fffffffffffffb38);
  if (!bVar2) {
    local_1 = 0;
    goto LAB_00201ecd;
  }
  BamMultiReader::BamMultiReader((BamMultiReader *)in_stack_fffffffffffffb50);
  bVar2 = BamMultiReader::Open
                    ((BamMultiReader *)in_stack_fffffffffffffb40,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffffb38);
  if (bVar2) {
    BamMultiReader::GetHeaderText_abi_cxx11_((BamMultiReader *)in_stack_fffffffffffffb38);
    BamMultiReader::GetReferenceData((BamMultiReader *)in_stack_fffffffffffffb38);
    std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>::operator=
              (in_RDI,(vector<BamTools::RefData,_std::allocator<BamTools::RefData>_> *)
                      in_stack_fffffffffffffbd8);
    std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>::~vector
              (in_stack_fffffffffffffb50);
    Options::StandardOut_abi_cxx11_();
    std::operator==(in_stack_fffffffffffffb60,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    CONCAT17(in_stack_fffffffffffffb5f,
                             CONCAT16(in_stack_fffffffffffffb5e,
                                      CONCAT15(in_stack_fffffffffffffb5d,
                                               CONCAT14(in_stack_fffffffffffffb5c,
                                                        in_stack_fffffffffffffb58)))));
    BamWriter::BamWriter((BamWriter *)in_stack_fffffffffffffb50);
    BamWriter::SetCompressionMode
              ((BamWriter *)in_stack_fffffffffffffb40,(CompressionMode *)in_stack_fffffffffffffb38);
    bVar2 = BamWriter::Open((BamWriter *)in_stack_fffffffffffffb50,
                            (string *)in_stack_fffffffffffffb48,&in_stack_fffffffffffffb40->Name,
                            (RefVector *)in_stack_fffffffffffffb38);
    if (bVar2) {
      BamAlignment::BamAlignment(in_stack_fffffffffffffb80);
      if ((((in_RDI[1].super__Vector_base<BamTools::RefData,_std::allocator<BamTools::RefData>_>.
             _M_impl.super__Vector_impl_data._M_start)->RefName).field_0x3 & 1) == 0) {
        while (bVar2 = BamMultiReader::GetNextAlignment
                                 ((BamMultiReader *)in_stack_fffffffffffffb40,
                                  in_stack_fffffffffffffb38), bVar2) {
          bVar2 = CheckAlignment((FilterToolPrivate *)in_stack_fffffffffffffb40,
                                 in_stack_fffffffffffffb38);
          if (bVar2) {
            BamWriter::SaveAlignment
                      ((BamWriter *)in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
          }
        }
LAB_00201e39:
        BamMultiReader::Close((BamMultiReader *)0x201e46);
        BamWriter::Close((BamWriter *)0x201e55);
        local_1 = 1;
      }
      else {
        local_410[3] = 0xffffffff;
        local_410[2] = 0xffffffff;
        local_410[1] = 0xffffffff;
        local_410[0] = -1;
        BamRegion::BamRegion(local_400,local_410 + 3,local_410 + 2,local_410 + 1,local_410);
        uVar3 = Utilities::ParseRegionString
                          (in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0,
                           in_stack_fffffffffffffcc8);
        if ((bool)uVar3) {
          BamMultiReader::LocateIndexes
                    ((BamMultiReader *)in_stack_fffffffffffffb40,
                     (IndexType *)in_stack_fffffffffffffb38);
          bVar2 = BamMultiReader::HasIndexes((BamMultiReader *)0x201bcb);
          if (bVar2) {
            bVar2 = BamMultiReader::SetRegion
                              (in_stack_fffffffffffffb70,
                               (int *)CONCAT17(in_stack_fffffffffffffb6f,
                                               CONCAT16(in_stack_fffffffffffffb6e,
                                                        CONCAT15(uVar3,CONCAT14(bVar2,
                                                  in_stack_fffffffffffffb68)))),
                               (int *)in_stack_fffffffffffffb60,
                               (int *)CONCAT17(in_stack_fffffffffffffb5f,
                                               CONCAT16(in_stack_fffffffffffffb5e,
                                                        CONCAT15(in_stack_fffffffffffffb5d,
                                                                 CONCAT14(in_stack_fffffffffffffb5c,
                                                                          in_stack_fffffffffffffb58)
                                                                ))),(int *)in_stack_fffffffffffffb50
                              );
            if (!bVar2) {
              poVar5 = std::operator<<((ostream *)&std::cerr,
                                       "bamtools filter ERROR: set region failed. Check that REGION describes a valid range"
                                      );
              std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
              BamMultiReader::Close((BamMultiReader *)0x201c55);
              local_1 = 0;
              goto LAB_00201e6a;
            }
            while (bVar2 = BamMultiReader::GetNextAlignment
                                     ((BamMultiReader *)in_stack_fffffffffffffb40,
                                      in_stack_fffffffffffffb38), bVar2) {
              bVar2 = CheckAlignment((FilterToolPrivate *)in_stack_fffffffffffffb40,
                                     in_stack_fffffffffffffb38);
              if (bVar2) {
                BamWriter::SaveAlignment
                          ((BamWriter *)in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
              }
            }
          }
          else {
            while (bVar2 = BamMultiReader::GetNextAlignment
                                     ((BamMultiReader *)in_stack_fffffffffffffb40,
                                      in_stack_fffffffffffffb38), bVar2) {
              if ((((local_400[0].LeftRefID <= local_348) &&
                   (local_400[0].LeftPosition <= local_344 + local_3d0)) &&
                  (local_348 <= local_400[0].RightRefID)) &&
                 ((local_344 <= local_400[0].RightPosition &&
                  (bVar2 = CheckAlignment((FilterToolPrivate *)in_stack_fffffffffffffb40,
                                          in_stack_fffffffffffffb38), bVar2)))) {
                BamWriter::SaveAlignment
                          ((BamWriter *)in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
              }
            }
          }
          goto LAB_00201e39;
        }
        poVar5 = std::operator<<((ostream *)&std::cerr,
                                 "bamtools filter ERROR: could not parse REGION: ");
        poVar5 = std::operator<<(poVar5,(string *)
                                        in_RDI[1].
                                        super__Vector_base<BamTools::RefData,_std::allocator<BamTools::RefData>_>
                                        ._M_impl.super__Vector_impl_data._M_start[2].RefName.field_2
                                        ._M_local_buf);
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        in_stack_fffffffffffffb40 =
             (BamAlignment *)
             std::operator<<((ostream *)&std::cerr,
                             "Check that REGION is in valid format (see documentation) and that the coordinates are valid"
                            );
        std::ostream::operator<<(in_stack_fffffffffffffb40,std::endl<char,std::char_traits<char>>);
        BamMultiReader::Close((BamMultiReader *)0x201e20);
        local_1 = 0;
      }
LAB_00201e6a:
      local_228 = 1;
      BamAlignment::~BamAlignment(in_stack_fffffffffffffb40);
    }
    else {
      poVar5 = std::operator<<((ostream *)&std::cerr,"bamtools filter ERROR: could not open ");
      poVar5 = std::operator<<(poVar5,(string *)
                                      (in_RDI[1].
                                       super__Vector_base<BamTools::RefData,_std::allocator<BamTools::RefData>_>
                                       ._M_impl.super__Vector_impl_data._M_start[1].RefName.field_2.
                                       _M_local_buf + 8));
      poVar5 = std::operator<<(poVar5," for writing.");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      BamMultiReader::Close((BamMultiReader *)0x201a1c);
      local_1 = 0;
      local_228 = 1;
    }
    BamWriter::~BamWriter((BamWriter *)in_stack_fffffffffffffb40);
    std::__cxx11::string::~string(local_270);
  }
  else {
    poVar5 = std::operator<<((ostream *)&std::cerr,
                             "bamtools filter ERROR: could not open input files for reading.");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    local_1 = 0;
    local_228 = 1;
  }
  BamMultiReader::~BamMultiReader((BamMultiReader *)in_stack_fffffffffffffb40);
LAB_00201ecd:
  return (bool)(local_1 & 1);
}

Assistant:

bool FilterTool::FilterToolPrivate::Run()
{

    // set to default input if none provided
    if (!m_settings->HasInput && !m_settings->HasInputFilelist)
        m_settings->InputFiles.push_back(Options::StandardIn());

    // add files in the filelist to the input file list
    if (m_settings->HasInputFilelist) {

        std::ifstream filelist(m_settings->InputFilelist.c_str(), std::ios::in);
        if (!filelist.is_open()) {
            std::cerr << "bamtools filter ERROR: could not open input BAM file list... Aborting."
                      << std::endl;
            return false;
        }

        std::string line;
        while (std::getline(filelist, line))
            m_settings->InputFiles.push_back(line);
    }

    // initialize defined properties & user-specified filters
    // quit if failed
    if (!SetupFilters()) return false;

    // open reader without index
    BamMultiReader reader;
    if (!reader.Open(m_settings->InputFiles)) {
        std::cerr << "bamtools filter ERROR: could not open input files for reading." << std::endl;
        return false;
    }

    // retrieve reader header & reference data
    const std::string headerText = reader.GetHeaderText();
    filterToolReferences = reader.GetReferenceData();

    // determine compression mode for BamWriter
    bool writeUncompressed =
        (m_settings->OutputFilename == Options::StandardOut() && !m_settings->IsForceCompression);
    BamWriter::CompressionMode compressionMode = BamWriter::Compressed;
    if (writeUncompressed) compressionMode = BamWriter::Uncompressed;

    // open BamWriter
    BamWriter writer;
    writer.SetCompressionMode(compressionMode);
    if (!writer.Open(m_settings->OutputFilename, headerText, filterToolReferences)) {
        std::cerr << "bamtools filter ERROR: could not open " << m_settings->OutputFilename
                  << " for writing." << std::endl;
        reader.Close();
        return false;
    }

    // if no region specified, filter entire file
    BamAlignment al;
    if (!m_settings->HasRegion) {
        while (reader.GetNextAlignment(al)) {
            if (CheckAlignment(al)) writer.SaveAlignment(al);
        }
    }

    // otherwise attempt to use region as constraint
    else {

        // if region string parses OK
        BamRegion region;
        if (Utilities::ParseRegionString(m_settings->Region, reader, region)) {

            // attempt to find index files
            reader.LocateIndexes();

            // if index data available for all BAM files, we can use SetRegion
            if (reader.HasIndexes()) {

                // attempt to use SetRegion(), if failed report error
                if (!reader.SetRegion(region.LeftRefID, region.LeftPosition, region.RightRefID,
                                      region.RightPosition)) {
                    std::cerr << "bamtools filter ERROR: set region failed. Check that REGION "
                                 "describes a valid range"
                              << std::endl;
                    reader.Close();
                    return false;
                }

                // everything checks out, just iterate through specified region, filtering alignments
                while (reader.GetNextAlignment(al))
                    if (CheckAlignment(al)) writer.SaveAlignment(al);
            }

            // no index data available, we have to iterate through until we
            // find overlapping alignments
            else {
                while (reader.GetNextAlignment(al)) {
                    if ((al.RefID >= region.LeftRefID) &&
                        ((al.Position + al.Length) >= region.LeftPosition) &&
                        (al.RefID <= region.RightRefID) && (al.Position <= region.RightPosition)) {
                        if (CheckAlignment(al)) writer.SaveAlignment(al);
                    }
                }
            }
        }

        // error parsing REGION string
        else {
            std::cerr << "bamtools filter ERROR: could not parse REGION: " << m_settings->Region
                      << std::endl;
            std::cerr << "Check that REGION is in valid format (see documentation) and that the "
                         "coordinates are valid"
                      << std::endl;
            reader.Close();
            return false;
        }
    }

    // clean up & exit
    reader.Close();
    writer.Close();
    return true;
}